

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  ImWchar *__dest;
  float fVar1;
  uchar uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  int iVar5;
  int iVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  StbUndoRecord *pSVar9;
  bool bVar10;
  short sVar11;
  ImWchar IVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  StbFindState *pSVar16;
  long lVar17;
  int iVar18;
  int *piVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  float fVar23;
  StbFindState find;
  StbTexteditRow row;
  
  state = &this->Stb;
  uVar2 = (this->Stb).single_line;
LAB_00134737:
  switch(key) {
  case 0x200000:
    goto switchD_0013474a_caseD_200000;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      state->cursor = state->cursor + 1;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    ImStb::stb_textedit_clamp(this,state);
    goto LAB_00134e86;
  case 0x200002:
switchD_0013474a_caseD_200002:
    if (uVar2 == '\0') {
      if ((key & 0x400000U) == 0) {
        if ((this->Stb).select_start != (this->Stb).select_end) {
          ImStb::stb_textedit_move_to_first(state);
        }
      }
      else {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_find_charpos(&find,this,(this->Stb).cursor,(uint)(this->Stb).single_line);
      if (find.prev_first == find.first_char) goto LAB_00134e8a;
      pSVar16 = (StbFindState *)&(this->Stb).preferred_x;
      if ((this->Stb).has_preferred_x == '\0') {
        pSVar16 = &find;
      }
      fVar1 = pSVar16->x;
      (this->Stb).cursor = find.prev_first;
      ImStb::STB_TEXTEDIT_LAYOUTROW(&row,this,find.prev_first);
      iVar13 = 0;
      if (row.num_chars < 1) {
        row.num_chars = 0;
        iVar13 = 0;
      }
      goto LAB_00134d04;
    }
    key = key & 0x400000U | 0x200000;
    goto LAB_00134737;
  case 0x200003:
switchD_0013474a_caseD_200003:
    if (uVar2 != '\0') goto code_r0x00134788;
    if ((key & 0x400000U) == 0) {
      if ((this->Stb).select_start != (this->Stb).select_end) {
        ImStb::stb_textedit_move_to_last(this,state);
      }
    }
    else {
      ImStb::stb_textedit_prep_selection_at_cursor(state);
    }
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_find_charpos(&find,this,(this->Stb).cursor,(uint)(this->Stb).single_line);
    if (find.length == 0) goto LAB_00134e8a;
    pSVar16 = (StbFindState *)&(this->Stb).preferred_x;
    if ((this->Stb).has_preferred_x == '\0') {
      pSVar16 = &find;
    }
    fVar1 = pSVar16->x;
    iVar20 = find.length + find.first_char;
    (this->Stb).cursor = iVar20;
    ImStb::STB_TEXTEDIT_LAYOUTROW(&row,this,iVar20);
    iVar13 = 0;
    if (row.num_chars < 1) {
      row.num_chars = 0;
      iVar13 = 0;
    }
    goto LAB_00134c44;
  case 0x200004:
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_move_to_first(state);
    if ((this->Stb).single_line == '\0') {
      iVar13 = state->cursor;
      while ((0 < iVar13 && (IVar12 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar13 + -1), IVar12 != 10)))
      {
        iVar13 = state->cursor + -1;
        state->cursor = iVar13;
      }
    }
    else {
      state->cursor = 0;
    }
    goto LAB_00134e86;
  case 0x200005:
    iVar13 = this->CurLenW;
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_move_to_first(state);
    if ((this->Stb).single_line == '\0') {
      iVar20 = state->cursor;
      while ((iVar20 < iVar13 && (IVar12 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar20), IVar12 != 10)))
      {
        iVar20 = state->cursor + 1;
        state->cursor = iVar20;
      }
    }
    else {
      state->cursor = iVar13;
    }
    goto LAB_00134e86;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_00134e86;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_00134e86;
  case 0x200008:
switchD_0013474a_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar13 = (this->Stb).cursor;
      if (iVar13 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar13,1);
      }
      goto LAB_00134e86;
    }
    break;
  case 0x200009:
switchD_0013474a_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      ImStb::stb_textedit_clamp(this,state);
      iVar13 = (this->Stb).cursor;
      if (0 < iVar13) {
        ImStb::stb_textedit_delete(this,state,iVar13 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_00134e86;
    }
    break;
  case 0x20000a:
    lVar17 = (long)(this->Stb).undostate.undo_point;
    if (lVar17 != 0) {
      iVar13 = (this->Stb).undostate.undo_rec[lVar17 + -1].where;
      iVar20 = (this->Stb).undostate.undo_rec[lVar17 + -1].insert_length;
      iVar5 = (this->Stb).undostate.undo_rec[lVar17 + -1].delete_length;
      iVar6 = (this->Stb).undostate.undo_rec[lVar17 + -1].char_storage;
      uVar15 = (ulong)(this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_rec[uVar15 - 1].char_storage = -1;
      (this->Stb).undostate.undo_rec[uVar15 - 1].insert_length = iVar5;
      (this->Stb).undostate.undo_rec[uVar15 - 1].delete_length = iVar20;
      (this->Stb).undostate.undo_rec[uVar15 - 1].where = iVar13;
      if (iVar5 != 0) {
        iVar18 = (this->Stb).undostate.undo_char_point;
        if (iVar18 + iVar5 < 999) {
          do {
            sVar11 = (short)uVar15;
            iVar21 = (this->Stb).undostate.redo_char_point;
            do {
              lVar17 = (long)sVar11;
              if (iVar18 + iVar5 <= iVar21) {
                piVar19 = &(this->Stb).undostate.undo_rec[lVar17 + -1].char_storage;
                *piVar19 = iVar21 - iVar5;
                (this->Stb).undostate.redo_char_point = iVar21 - iVar5;
                lVar17 = 0;
                iVar18 = 0;
                if (0 < iVar5) {
                  iVar18 = iVar5;
                }
                for (; iVar18 != (int)lVar17; lVar17 = lVar17 + 1) {
                  IVar12 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar13 + (int)lVar17);
                  (this->Stb).undostate.undo_char[*piVar19 + lVar17] = IVar12;
                }
                goto LAB_00134b63;
              }
              if (sVar11 == 99) goto LAB_00134e86;
            } while (0x62 < sVar11);
            if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
              iVar18 = (this->Stb).undostate.undo_rec[0x62].insert_length;
              iVar21 = iVar21 + iVar18;
              (this->Stb).undostate.redo_char_point = iVar21;
              __dest = (this->Stb).undostate.undo_char + iVar21;
              memmove(__dest,__dest + -(long)iVar18,(long)(999 - iVar21) * 2);
              sVar11 = (this->Stb).undostate.redo_point;
              lVar17 = (long)sVar11;
              piVar19 = &(this->Stb).undostate.undo_rec[lVar17].char_storage;
              for (lVar22 = lVar17; lVar22 < 0x62; lVar22 = lVar22 + 1) {
                if (-1 < *piVar19) {
                  *piVar19 = *piVar19 + iVar18;
                }
                piVar19 = piVar19 + 4;
              }
            }
            if (sVar11 < 0) {
              __assert_fail("((char*)(state->undo_rec + state->redo_point)) >= buf_begin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imstb_textedit.h"
                            ,0x475,"void ImStb::stb_textedit_discard_redo(StbUndoState *)");
            }
            memmove((this->Stb).undostate.undo_rec + lVar17 + 1,
                    (this->Stb).undostate.undo_rec + lVar17,lVar17 * -0x10 + 0x620);
            iVar18 = (this->Stb).undostate.undo_char_point;
            uVar14 = *(int *)&(this->Stb).undostate.redo_point + 1;
            uVar15 = (ulong)uVar14;
            (this->Stb).undostate.redo_point = (short)uVar14;
          } while( true );
        }
        (this->Stb).undostate.undo_rec[uVar15 - 1].insert_length = 0;
LAB_00134b63:
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar13,iVar5);
      }
      if (iVar20 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar13,(this->Stb).undostate.undo_char + iVar6,iVar20);
        piVar19 = &(this->Stb).undostate.undo_char_point;
        *piVar19 = *piVar19 - iVar20;
      }
      (this->Stb).cursor = iVar20 + iVar13;
      uVar4 = (this->Stb).undostate.undo_point;
      uVar8 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar4 + -1;
      (this->Stb).undostate.redo_point = uVar8 + -1;
    }
    goto LAB_00134e86;
  case 0x20000b:
    lVar17 = (long)(this->Stb).undostate.redo_point;
    if (lVar17 != 99) {
      sVar11 = (this->Stb).undostate.undo_point;
      iVar13 = (this->Stb).undostate.undo_rec[lVar17].where;
      iVar20 = (this->Stb).undostate.undo_rec[lVar17].insert_length;
      iVar5 = (this->Stb).undostate.undo_rec[lVar17].delete_length;
      iVar6 = (this->Stb).undostate.undo_rec[lVar17].char_storage;
      (this->Stb).undostate.undo_rec[sVar11].delete_length = iVar20;
      (this->Stb).undostate.undo_rec[sVar11].insert_length = iVar5;
      (this->Stb).undostate.undo_rec[sVar11].where = iVar13;
      (this->Stb).undostate.undo_rec[sVar11].char_storage = -1;
      if (iVar5 != 0) {
        iVar21 = (this->Stb).undostate.undo_char_point;
        iVar18 = iVar21 + iVar5;
        if ((this->Stb).undostate.redo_char_point < iVar18) {
          pSVar9 = (this->Stb).undostate.undo_rec + sVar11;
          pSVar9->insert_length = 0;
          pSVar9->delete_length = 0;
        }
        else {
          (this->Stb).undostate.undo_rec[sVar11].char_storage = iVar21;
          (this->Stb).undostate.undo_char_point = iVar18;
          iVar18 = iVar5;
          for (lVar17 = 0; (int)lVar17 < iVar18; lVar17 = lVar17 + 1) {
            IVar12 = ImStb::STB_TEXTEDIT_GETCHAR
                               (this,(this->Stb).undostate.undo_rec[sVar11].where + (int)lVar17);
            (this->Stb).undostate.undo_char
            [(this->Stb).undostate.undo_rec[sVar11].char_storage + lVar17] = IVar12;
            iVar18 = (this->Stb).undostate.undo_rec[sVar11].insert_length;
          }
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar13,iVar5);
      }
      if (iVar20 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar13,(this->Stb).undostate.undo_char + iVar6,iVar20);
        piVar19 = &(this->Stb).undostate.redo_char_point;
        *piVar19 = *piVar19 + iVar20;
      }
      (this->Stb).cursor = iVar20 + iVar13;
      uVar3 = (this->Stb).undostate.undo_point;
      uVar7 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar3 + 1;
      (this->Stb).undostate.redo_point = uVar7 + 1;
    }
    goto LAB_00134e86;
  case 0x20000c:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar13 = ImStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->Stb).cursor);
      goto LAB_001349a4;
    }
    ImStb::stb_textedit_move_to_first(state);
    goto LAB_00134e8a;
  case 0x20000d:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar13 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
LAB_001349a4:
      (this->Stb).cursor = iVar13;
LAB_001349a7:
      ImStb::stb_textedit_clamp(this,state);
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    goto LAB_00134e8a;
  default:
    switch(key) {
    case 0x600000:
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      iVar13 = (this->Stb).select_end;
      if (0 < iVar13) {
        iVar13 = iVar13 + -1;
        goto LAB_001348d1;
      }
      break;
    case 0x600001:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      piVar19 = &(this->Stb).select_end;
      *piVar19 = *piVar19 + 1;
      ImStb::stb_textedit_clamp(this,state);
      iVar13 = (this->Stb).select_end;
      break;
    case 0x600002:
      goto switchD_0013474a_caseD_200002;
    case 0x600003:
      goto switchD_0013474a_caseD_200003;
    case 0x600004:
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->Stb).single_line == '\0') {
        iVar13 = state->cursor;
        goto LAB_00134e3c;
      }
      state->cursor = 0;
      iVar13 = 0;
      goto LAB_00134868;
    case 0x600005:
      iVar13 = this->CurLenW;
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->Stb).single_line == '\0') {
        iVar20 = state->cursor;
        goto LAB_00134e65;
      }
      state->cursor = iVar13;
      iVar20 = iVar13;
      goto LAB_00134e83;
    case 0x600006:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      (this->Stb).select_end = 0;
      (this->Stb).cursor = 0;
      goto LAB_00134e86;
    case 0x600007:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      iVar13 = this->CurLenW;
LAB_001348d1:
      (this->Stb).select_end = iVar13;
      break;
    case 0x600008:
      goto switchD_0013474a_caseD_200008;
    case 0x600009:
      goto switchD_0013474a_caseD_200009;
    default:
      uVar14 = 0;
      if (key < 0x200000) {
        uVar14 = key;
      }
      if (((int)uVar14 < 1) || (find.x._0_2_ = (undefined2)uVar14, uVar14 == 10 && uVar2 != '\0'))
      goto LAB_00134e8a;
      if (((this->Stb).insert_mode == '\0') ||
         (((this->Stb).select_start != (this->Stb).select_end ||
          (iVar13 = (this->Stb).cursor, this->CurLenW <= iVar13)))) {
        ImStb::stb_textedit_delete_selection(this,state);
        bVar10 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,(ImWchar *)&find,1);
        if (!bVar10) goto LAB_00134e8a;
        ImStb::stb_text_makeundo_insert(state,state->cursor,1);
      }
      else {
        ImStb::stb_text_makeundo_replace(this,state,iVar13,1,1);
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar10 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,(ImWchar *)&find,1);
        if (!bVar10) goto LAB_00134e8a;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_00134e86;
    case 0x60000c:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar13 = ImStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->Stb).cursor);
      goto LAB_0013490c;
    case 0x60000d:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar13 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
LAB_0013490c:
      (this->Stb).cursor = iVar13;
      (this->Stb).select_end = iVar13;
      goto LAB_001349a7;
    }
    (this->Stb).cursor = iVar13;
    goto LAB_00134e86;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_00134e86;
LAB_00134e65:
  if (iVar13 <= iVar20) goto LAB_00134e83;
  IVar12 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar20);
  iVar20 = (this->Stb).cursor;
  if (IVar12 == 10) goto LAB_00134e83;
  iVar20 = iVar20 + 1;
  state->cursor = iVar20;
  goto LAB_00134e65;
LAB_00134e83:
  (this->Stb).select_end = iVar20;
  goto LAB_00134e86;
LAB_00134e3c:
  if (iVar13 < 1) goto LAB_00134868;
  IVar12 = ImStb::STB_TEXTEDIT_GETCHAR(this,iVar13 + -1);
  iVar13 = (this->Stb).cursor;
  if (IVar12 == 10) goto LAB_00134868;
  iVar13 = iVar13 + -1;
  state->cursor = iVar13;
  goto LAB_00134e3c;
LAB_00134868:
  (this->Stb).select_end = iVar13;
  goto LAB_00134e86;
code_r0x00134788:
  key = key & 0x400000U | 0x200001;
  goto LAB_00134737;
LAB_00134c44:
  if (row.num_chars == iVar13) goto LAB_00134d3f;
  fVar23 = ImStb::STB_TEXTEDIT_GETWIDTH(this,iVar20,iVar13);
  if (((fVar23 == -1.0) && (!NAN(fVar23))) || (row.x0 = row.x0 + fVar23, fVar1 < row.x0))
  goto LAB_00134d3f;
  state->cursor = state->cursor + 1;
  iVar13 = iVar13 + 1;
  goto LAB_00134c44;
LAB_00134d04:
  if (row.num_chars == iVar13) goto LAB_00134d3f;
  fVar23 = ImStb::STB_TEXTEDIT_GETWIDTH(this,find.prev_first,iVar13);
  if (((fVar23 == -1.0) && (!NAN(fVar23))) || (row.x0 = row.x0 + fVar23, fVar1 < row.x0))
  goto LAB_00134d3f;
  state->cursor = state->cursor + 1;
  iVar13 = iVar13 + 1;
  goto LAB_00134d04;
LAB_00134d3f:
  ImStb::stb_textedit_clamp(this,state);
  (this->Stb).has_preferred_x = '\x01';
  (this->Stb).preferred_x = fVar1;
  if ((key & 0x400000U) != 0) {
    (this->Stb).select_end = (this->Stb).cursor;
  }
  goto LAB_00134e8a;
switchD_0013474a_caseD_200000:
  if ((this->Stb).select_start == (this->Stb).select_end) {
    if (0 < state->cursor) {
      state->cursor = state->cursor + -1;
    }
  }
  else {
    ImStb::stb_textedit_move_to_first(state);
  }
LAB_00134e86:
  (this->Stb).has_preferred_x = '\0';
LAB_00134e8a:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}